

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void __thiscall
EDLines::EDLines(EDLines *this,Mat *srcImage,double _line_error,int _min_line_len,
                double _max_distance_between_two_lines,double _max_error)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  unsigned_long *puVar9;
  double *x_00;
  double *y_00;
  reference pvVar10;
  NFALUT *pNVar11;
  reference pvVar12;
  double dVar13;
  double dVar14;
  Point_<double> local_178;
  Point_<double> local_168;
  LS local_158;
  undefined1 local_138 [8];
  Point2d end;
  Point2d start;
  int i_1;
  int i;
  int size;
  int lutSize;
  double logNT;
  double prob;
  undefined1 local_f0 [4];
  int k_1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> segment;
  int k;
  int segmentNumber_1;
  double *y;
  double *x;
  size_type segment_size;
  unsigned_long uStack_b0;
  int segmentNumber;
  size_t buffer_size;
  Mat local_98 [96];
  double local_38;
  double _max_error_local;
  double _max_distance_between_two_lines_local;
  double dStack_20;
  int _min_line_len_local;
  double _line_error_local;
  Mat *srcImage_local;
  EDLines *this_local;
  
  local_38 = _max_error;
  _max_error_local = _max_distance_between_two_lines;
  _max_distance_between_two_lines_local._4_4_ = _min_line_len;
  dStack_20 = _line_error;
  _line_error_local = (double)srcImage;
  srcImage_local = (Mat *)this;
  cv::Mat::Mat(local_98,srcImage);
  ED::ED(&this->super_ED,local_98,SOBEL_OPERATOR,0x24,8,1,10,1.0,true);
  cv::Mat::~Mat(local_98);
  std::vector<LineSegment,_std::allocator<LineSegment>_>::vector(&this->lines);
  std::vector<LineSegment,_std::allocator<LineSegment>_>::vector(&this->invalidLines);
  std::vector<LS,_std::allocator<LS>_>::vector(&this->linePoints);
  this->min_line_len = _max_distance_between_two_lines_local._4_4_;
  this->line_error = dStack_20;
  this->max_distance_between_two_lines = _max_error_local;
  this->max_error = local_38;
  if (this->min_line_len == -1) {
    iVar4 = ComputeMinLineLength(this);
    this->min_line_len = iVar4;
  }
  if (this->min_line_len < 9) {
    this->min_line_len = 9;
  }
  uStack_b0 = (unsigned_long)(((this->super_ED).width + (this->super_ED).height) * 8);
  segment_size._4_4_ = 0;
  while( true ) {
    uVar6 = (ulong)segment_size._4_4_;
    sVar7 = std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::size(&(this->super_ED).segmentPoints);
    if (sVar7 <= uVar6) break;
    pvVar8 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[](&(this->super_ED).segmentPoints,(long)segment_size._4_4_);
    x = (double *)std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar8);
    puVar9 = std::max<unsigned_long>(&stack0xffffffffffffff50,(unsigned_long *)&x);
    uStack_b0 = *puVar9;
    segment_size._4_4_ = segment_size._4_4_ + 1;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_b0;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  x_00 = (double *)operator_new__(uVar6);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_b0;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  y_00 = (double *)operator_new__(uVar6);
  this->linesNo = 0;
  segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    uVar6 = (ulong)segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar7 = std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::size(&(this->super_ED).segmentPoints);
    if (sVar7 <= uVar6) break;
    segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    pvVar8 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[](&(this->super_ED).segmentPoints,
                          (long)segment.
                                super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0,pvVar8);
    prob._4_4_ = 0;
    while( true ) {
      sVar7 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0);
      if (sVar7 <= (ulong)(long)prob._4_4_) break;
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0,
                           (long)prob._4_4_);
      x_00[prob._4_4_] = (double)pvVar10->x;
      pvVar10 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                          ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0,
                           (long)prob._4_4_);
      y_00[prob._4_4_] = (double)pvVar10->y;
      prob._4_4_ = prob._4_4_ + 1;
    }
    sVar7 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0);
    SplitSegment2Lines(this,x_00,y_00,(int)sVar7,
                       segment.
                       super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_f0);
    segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         segment.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  JoinCollinearLines(this);
  this->prec = 0.39269908169872414;
  dVar13 = log10((double)(this->super_ED).width);
  dVar14 = log10((double)(this->super_ED).height);
  iVar4 = (this->super_ED).width;
  iVar1 = (this->super_ED).height;
  iVar5 = iVar4 + iVar1;
  if (iVar5 < 0) {
    iVar5 = iVar4 + 7 + iVar1;
  }
  pNVar11 = (NFALUT *)operator_new(0x20);
  NFALUT::NFALUT(pNVar11,iVar5 >> 3,0.125,dVar13 + dVar14 + dVar13 + dVar14);
  this->nfa = pNVar11;
  ValidateLineSegments(this);
  sVar7 = std::vector<LineSegment,_std::allocator<LineSegment>_>::size(&this->lines);
  for (start.y._4_4_ = 1; start.y._4_4_ <= (int)sVar7 - this->linesNo;
      start.y._4_4_ = start.y._4_4_ + 1) {
    std::vector<LineSegment,_std::allocator<LineSegment>_>::pop_back(&this->lines);
  }
  for (start.y._0_4_ = 0; start.y._0_4_ < this->linesNo; start.y._0_4_ = start.y._0_4_ + 1) {
    pvVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                        (&this->lines,(long)start.y._0_4_);
    dVar13 = pvVar12->sx;
    pvVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                        (&this->lines,(long)start.y._0_4_);
    cv::Point_<double>::Point_((Point_<double> *)&end.y,dVar13,pvVar12->sy);
    pvVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                        (&this->lines,(long)start.y._0_4_);
    dVar13 = pvVar12->ex;
    pvVar12 = std::vector<LineSegment,_std::allocator<LineSegment>_>::operator[]
                        (&this->lines,(long)start.y._0_4_);
    cv::Point_<double>::Point_((Point_<double> *)local_138,dVar13,pvVar12->ey);
    cv::Point_<double>::Point_(&local_168,(Point_<double> *)&end.y);
    cv::Point_<double>::Point_(&local_178,(Point_<double> *)local_138);
    LS::LS(&local_158,&local_168,&local_178);
    std::vector<LS,_std::allocator<LS>_>::push_back(&this->linePoints,&local_158);
  }
  if (x_00 != (double *)0x0) {
    operator_delete__(x_00);
  }
  if (y_00 != (double *)0x0) {
    operator_delete__(y_00);
  }
  pNVar11 = this->nfa;
  if (pNVar11 != (NFALUT *)0x0) {
    NFALUT::~NFALUT(pNVar11);
    operator_delete(pNVar11);
  }
  return;
}

Assistant:

EDLines::EDLines(Mat srcImage ,  double _line_error, int _min_line_len, double _max_distance_between_two_lines , double _max_error)
	:ED(srcImage, SOBEL_OPERATOR, 36, 8) 
{
	min_line_len = _min_line_len;
	line_error = _line_error;
	max_distance_between_two_lines = _max_distance_between_two_lines;
	max_error = _max_error;

	if(min_line_len == -1) // If no initial value given, compute it 
		min_line_len = ComputeMinLineLength();

	if (min_line_len < 9) // avoids small line segments in the result. Might be deleted!
		min_line_len = 9;



	// Temporary buffers used during line fitting
	size_t buffer_size = (width + height) * 8;
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		auto segment_size = segmentPoints[segmentNumber].size();
		buffer_size = std::max(buffer_size, segment_size);
	}
	double* x = new double[buffer_size];
	double* y = new double[buffer_size];

	linesNo = 0;
	
	// Use the whole segment
	for (int segmentNumber = 0; segmentNumber < segmentPoints.size(); segmentNumber++) {
		int k = 0;
		std::vector<Point> segment = segmentPoints[segmentNumber];
		for (int k = 0; k < segment.size(); k++) {
			x[k] = segment[k].x;
			y[k] = segment[k].y;
		}
		SplitSegment2Lines(x, y, (int)segment.size(), segmentNumber);
	}

	/*----------- JOIN COLLINEAR LINES ----------------*/
	JoinCollinearLines();

	/*----------- VALIDATE LINES ----------------*/
#define PRECISON_ANGLE 22.5 
	prec = (PRECISON_ANGLE / 180)*M_PI;
	double prob = 0.125;
#undef PRECISON_ANGLE

	double logNT = 2.0*(log10((double)width) + log10((double)height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table
	
	ValidateLineSegments();

	// Delete redundant space from lines
	// Pop them back
	int size = (int)lines.size();
	for (int i = 1; i <= size - linesNo; i++)
		lines.pop_back();
	
	for (int i = 0; i<linesNo; i++) {
		Point2d start(lines[i].sx, lines[i].sy);
		Point2d end(lines[i].ex, lines[i].ey);
		
		linePoints.push_back(LS(start, end));
	} //end-for

	delete[] x;
	delete[] y;
	delete nfa;
}